

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O0

int coda_ascbin_cursor_goto_array_element_by_index(coda_cursor *cursor,long index)

{
  int iVar1;
  long lVar2;
  long *in_FS_OFFSET;
  coda_type *local_48;
  long local_40;
  int64_t bit_size;
  long num_elements;
  long i;
  coda_type_array *array;
  long index_local;
  coda_cursor *cursor_local;
  
  if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
    local_48 = (coda_type *)cursor->stack[cursor->n + -1].type;
  }
  else {
    local_48 = (cursor->stack[cursor->n + -1].type)->definition;
  }
  i = (long)local_48;
  array = (coda_type_array *)index;
  index_local = (long)cursor;
  if (*(int *)(*in_FS_OFFSET + -0x1208) != 0) {
    iVar1 = coda_cursor_get_num_elements(cursor,&bit_size);
    if (iVar1 != 0) {
      return -1;
    }
    if (((long)array < 0) || (bit_size <= (long)array)) {
      coda_set_error(-0x6b,"array index (%ld) exceeds array range [0:%ld)",array,bit_size);
      return -1;
    }
  }
  *(int *)(index_local + 8) = *(int *)(index_local + 8) + 1;
  *(undefined8 *)(index_local + (long)(*(int *)(index_local + 8) + -1) * 0x18 + 0x20) =
       *(undefined8 *)(index_local + (long)(*(int *)(index_local + 8) + -2) * 0x18 + 0x20);
  if (*(long *)(*(long *)(i + 0x38) + 0x20) < 0) {
    for (num_elements = 0; num_elements < (long)array; num_elements = num_elements + 1) {
      *(undefined8 *)(index_local + 0x10 + (long)(*(int *)(index_local + 8) + -1) * 0x18) =
           *(undefined8 *)(i + 0x38);
      *(long *)(index_local + (long)(*(int *)(index_local + 8) + -1) * 0x18 + 0x18) = num_elements;
      iVar1 = coda_cursor_get_bit_size((coda_cursor *)index_local,&local_40);
      if (iVar1 != 0) {
        *(int *)(index_local + 8) = *(int *)(index_local + 8) + -1;
        return -1;
      }
      lVar2 = index_local + 0x10 + (long)(*(int *)(index_local + 8) + -1) * 0x18;
      *(long *)(lVar2 + 0x10) = local_40 + *(long *)(lVar2 + 0x10);
    }
  }
  else {
    lVar2 = index_local + 0x10 + (long)(*(int *)(index_local + 8) + -1) * 0x18;
    *(long *)(lVar2 + 0x10) =
         (long)array * *(long *)(*(long *)(i + 0x38) + 0x20) + *(long *)(lVar2 + 0x10);
  }
  *(undefined8 *)(index_local + 0x10 + (long)(*(int *)(index_local + 8) + -1) * 0x18) =
       *(undefined8 *)(i + 0x38);
  *(coda_type_array **)(index_local + (long)(*(int *)(index_local + 8) + -1) * 0x18 + 0x18) = array;
  return 0;
}

Assistant:

int coda_ascbin_cursor_goto_array_element_by_index(coda_cursor *cursor, long index)
{
    coda_type_array *array;
    long i;

    array = (coda_type_array *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

    /* check the range for index */
    if (coda_option_perform_boundary_checks)
    {
        long num_elements;

        if (coda_cursor_get_num_elements(cursor, &num_elements) != 0)
        {
            return -1;
        }
        if (index < 0 || index >= num_elements)
        {
            coda_set_error(CODA_ERROR_ARRAY_OUT_OF_BOUNDS, "array index (%ld) exceeds array range [0:%ld)", index,
                           num_elements);
            return -1;
        }
    }

    cursor->n++;
    cursor->stack[cursor->n - 1].bit_offset = cursor->stack[cursor->n - 2].bit_offset;

    if (array->base_type->bit_size >= 0)
    {
        /* if the array base type is simple, do a calculated index calculation. */
        cursor->stack[cursor->n - 1].bit_offset += index * array->base_type->bit_size;
    }
    else        /* not a simple base type, so walk the elements. */
    {
        for (i = 0; i < index; i++)
        {
            int64_t bit_size;

            cursor->stack[cursor->n - 1].type = (coda_dynamic_type *)array->base_type;
            cursor->stack[cursor->n - 1].index = i;
            if (coda_cursor_get_bit_size(cursor, &bit_size) != 0)
            {
                cursor->n--;
                return -1;
            }
            cursor->stack[cursor->n - 1].bit_offset += bit_size;
        }
    }
    cursor->stack[cursor->n - 1].type = (coda_dynamic_type *)array->base_type;
    cursor->stack[cursor->n - 1].index = index;

    return 0;
}